

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,2>,tcu::Vector<float,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  ostringstream *poVar1;
  pointer pVVar2;
  pointer pVVar3;
  Variable<tcu::Vector<float,_2>_> *pVVar4;
  pointer pcVar5;
  Variable<tcu::Matrix<float,_2,_2>_> *pVVar6;
  byte bVar7;
  undefined8 uVar8;
  pointer pMVar9;
  bool bVar10;
  bool bVar11;
  ContextType type;
  int iVar12;
  uint uVar13;
  _Rb_tree_node_base *p_Var14;
  char *__s;
  size_t sVar15;
  long *plVar16;
  ShaderExecutor *pSVar17;
  IVal *pIVar18;
  IVal *pIVar19;
  long lVar20;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  Vector<float,_2> *val;
  PrecisionCase *pPVar22;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  *pVVar23;
  byte bVar24;
  IVal in2;
  IVal in1;
  IVal in3;
  FuncSet funcs;
  ostringstream os;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  outputs;
  Environment env;
  ShaderSpec spec;
  ostringstream oss;
  PrecisionCase *local_528;
  undefined1 local_520 [8];
  size_type local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  undefined1 local_500 [16];
  undefined1 local_4f0 [64];
  string local_4b0;
  ulong local_490;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_488;
  FloatFormat *local_480;
  undefined1 local_478 [8];
  undefined8 uStack_470;
  _Base_ptr p_Stack_468;
  _Rb_tree_node_base *local_460;
  _Base_ptr local_458;
  double dStack_450;
  long local_448;
  ResultCollector *local_440;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Base_ptr local_418;
  Data DStack_410;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  double local_3f8;
  Interval local_3f0;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  FloatFormat local_2b8;
  double local_288;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [32];
  _Base_ptr p_Stack_188;
  double dStack_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_178;
  double dStack_170;
  double local_168;
  Interval local_160;
  ios_base local_138 [264];
  
  pVVar2 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_4f0._48_8_ = (long)pVVar3 - (long)pVVar2 >> 3;
  local_4f0._56_8_ = stmt;
  local_488 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  ::Outputs(&local_280,local_4f0._48_8_);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_2b8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_250._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_250._M_impl.super__Rb_tree_header._M_header;
  local_250._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_250._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_250._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_438 + 8);
  local_250._M_impl.super__Rb_tree_header._M_header._M_right =
       local_250._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Statement: ",0xb);
  (*(*(_func_int ***)local_4f0._56_8_)[2])(local_4f0._56_8_,poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_528 = this;
  local_4f0._32_8_ = variables;
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uStack_470 = (pointer)((ulong)uStack_470._4_4_ << 0x20);
  p_Stack_468 = (_Base_ptr)0x0;
  dStack_450 = 0.0;
  local_460 = (_Rb_tree_node_base *)&uStack_470;
  local_458 = (_Rb_tree_node_base *)&uStack_470;
  (*(*(_func_int ***)local_4f0._56_8_)[4])(local_4f0._56_8_,local_478);
  if (local_460 != (_Rb_tree_node_base *)&uStack_470) {
    p_Var14 = local_460;
    do {
      (**(code **)(**(long **)(p_Var14 + 1) + 0x30))(*(long **)(p_Var14 + 1),local_1a8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != (_Rb_tree_node_base *)&uStack_470);
  }
  pPVar22 = local_528;
  if (dStack_450 != 0.0) {
    local_438._0_8_ = ((local_528->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_438 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)local_500._0_8_,local_500._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_500._0_8_ != (IVal *)local_4f0) {
      operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_478);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"precision ",10);
  __s = glu::getPrecisionName((pPVar22->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)((long)&local_528 + *(long *)(local_438._0_8_ + -0x18)) + 0xf0);
  }
  else {
    sVar15 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,__s,sVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar5 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_528->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_528->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_528->m_extension);
    plVar16 = (long *)std::__cxx11::string::append(local_1a8);
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 == paVar21) {
      local_428._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_428._8_8_ = plVar16[3];
      local_438._0_8_ = &local_428;
    }
    else {
      local_428._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_438._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar16;
    }
    local_438._8_8_ = plVar16[1];
    *plVar16 = (long)paVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != &local_428) {
      operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar5) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_438,local_528,
             (((VariableP<tcu::Vector<float,_2>_> *)local_4f0._32_8_)->
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             ).m_ptr);
  uVar8 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar8 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._0_8_ != &local_428) {
    operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_438,local_528,
             (((VariableP<tcu::Vector<float,_2>_> *)(local_4f0._32_8_ + 0x50))->
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             ).m_ptr);
  uVar8 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_438);
  glu::VarType::operator=(&((pointer)(uVar8 + 0x38))->varType,(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._0_8_ != &local_428) {
    operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Matrix<float,2,2>>
            ((Symbol *)local_438,local_528,
             (((VariableP<tcu::Matrix<float,_2,_2>_> *)(local_4f0._32_8_ + 0x40))->
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             ).m_ptr);
  uVar8 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar8 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._0_8_ != &local_428) {
    operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  (*(*(_func_int ***)local_4f0._56_8_)[2])(local_4f0._56_8_,local_438);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar22 = local_528;
  pSVar17 = ShaderExecUtil::createExecutor
                      ((local_528->m_ctx).renderContext,(local_528->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  pVVar23 = (Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
             *)local_4f0._32_8_;
  local_438._0_8_ =
       (local_488->in0).
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_438._8_8_ =
       (local_488->in1).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_428._M_allocated_capacity =
       (size_type)
       (local_488->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_428._8_8_ =
       (local_488->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_280.out0.
       super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_280.out1.
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar17->_vptr_ShaderExecutor[3])
            (pSVar17,((pPVar22->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar12 = (*pSVar17->_vptr_ShaderExecutor[2])(pSVar17);
  if ((char)iVar12 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar17->_vptr_ShaderExecutor[5])(pSVar17);
  (*pSVar17->_vptr_ShaderExecutor[6])(pSVar17,local_4f0._48_8_,local_438,local_1a8);
  (*pSVar17->_vptr_ShaderExecutor[1])(pSVar17);
  local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
  local_1a8._8_8_ = (pointer)0x7ff0000000000000;
  local_1a8._16_8_ = (_Base_ptr)0xfff0000000000000;
  local_1a8._24_8_ = local_1a8._24_8_ & 0xffffffffffffff00;
  p_Stack_188 = (_Base_ptr)0x7ff0000000000000;
  dStack_180 = -INFINITY;
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_438);
  local_478 = (undefined1  [8])((ulong)local_478 & 0xffffffffffffff00);
  uStack_470 = (pointer)0x7ff0000000000000;
  p_Stack_468 = (_Base_ptr)0xfff0000000000000;
  local_460 = (_Rb_tree_node_base *)((ulong)local_460 & 0xffffffffffffff00);
  local_458 = (_Base_ptr)0x7ff0000000000000;
  dStack_450 = -INFINITY;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_250,
             (pVVar23->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_250,
             (((VariableP<deqp::gls::BuiltinPrecisionTests::Void> *)((long)pVVar23 + 0x10))->
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             ).m_ptr,(IVal *)local_500);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_250,
             (((VariableP<deqp::gls::BuiltinPrecisionTests::Void> *)((long)pVVar23 + 0x20))->
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             ).m_ptr,(IVal *)local_520);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_250,
             (((VariableP<deqp::gls::BuiltinPrecisionTests::Void> *)((long)pVVar23 + 0x30))->
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             ).m_ptr,(IVal *)(local_4f0 + 0x40));
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_250,
             (((VariableP<tcu::Matrix<float,_2,_2>_> *)((long)pVVar23 + 0x40))->
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             ).m_ptr,(IVal *)local_438);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_250,
             (((VariableP<tcu::Vector<float,_2>_> *)((long)pVVar23 + 0x50))->
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             ).m_ptr,(IVal *)local_478);
  if (pVVar3 == pVVar2) {
LAB_0086538e:
    local_438._0_8_ = ((pPVar22->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_438 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_480 = &(pPVar22->m_ctx).floatFormat;
    local_440 = &pPVar22->m_status;
    local_288 = (double)(local_4f0._48_8_ + (ulong)(local_4f0._48_8_ == 0));
    local_4f0._40_8_ = 0.0;
    local_490 = 0;
    do {
      tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_1a8);
      local_478 = (undefined1  [8])((ulong)local_478 & 0xffffffffffffff00);
      uStack_470 = (pointer)0x7ff0000000000000;
      p_Stack_468 = (_Base_ptr)0xfff0000000000000;
      local_460 = (_Rb_tree_node_base *)((ulong)local_460 & 0xffffffffffffff00);
      local_458 = (_Base_ptr)0x7ff0000000000000;
      dStack_450 = -INFINITY;
      if ((local_4f0._40_8_ & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((pPVar22->super_TestCase).super_TestNode.m_testCtx);
      }
      pVVar2 = (local_488->in0).
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_520._0_4_ = pVVar2[local_4f0._40_8_].m_data[0];
      local_520._4_4_ = pVVar2[local_4f0._40_8_].m_data[1];
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_500,local_480,(Vector<float,_2> *)local_520);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,local_480,(IVal *)local_500);
      pIVar18 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_250,
                           (pVVar23->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar18->m_data[1].m_lo = (double)local_418;
      pIVar18->m_data[1].m_hi = (double)CONCAT44(DStack_410.basic.precision,DStack_410.basic.type);
      pIVar18->m_data[0].m_hi = (double)local_428._M_allocated_capacity;
      *(undefined8 *)(pIVar18->m_data + 1) = local_428._8_8_;
      *(undefined8 *)pIVar18->m_data = local_438._0_8_;
      pIVar18->m_data[0].m_lo = (double)local_438._8_8_;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_250,
                 (pVVar23->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_250,
                 (pVVar23->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_250,
                 (pVVar23->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      DStack_410.basic.type = (pPVar22->m_ctx).precision;
      local_418 = (_Base_ptr)local_480->m_maxValue;
      local_438._0_8_ = *(undefined8 *)local_480;
      local_438._8_8_ = *(undefined8 *)&local_480->m_fractionBits;
      local_428._M_allocated_capacity = *(undefined8 *)&local_480->m_hasInf;
      local_428._8_8_ = *(undefined8 *)&local_480->m_exactPrecision;
      uStack_400 = 0;
      DStack_410._8_8_ = &local_250;
      (*(*(_func_int ***)local_4f0._56_8_)[3])(local_4f0._56_8_,(IVal *)local_438);
      pIVar18 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_250,
                           (pVVar23->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,&local_2b8,pIVar18);
      dStack_450 = (double)CONCAT44(DStack_410.basic.precision,DStack_410.basic.type);
      local_458 = local_418;
      p_Stack_468 = (_Base_ptr)local_428._M_allocated_capacity;
      local_460 = (_Rb_tree_node_base *)local_428._8_8_;
      local_478 = (undefined1  [8])local_438._0_8_;
      uStack_470 = (pointer)local_438._8_8_;
      local_448 = local_4f0._40_8_ * 8;
      bVar10 = contains<tcu::Vector<float,2>>
                         ((IVal *)local_478,
                          local_280.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_4f0._40_8_);
      local_438._0_8_ = &local_428;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 1 is outside acceptable range","");
      bVar10 = tcu::ResultCollector::check(local_440,bVar10,(string *)local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ != &local_428) {
        operator_delete((void *)local_438._0_8_,(ulong)(local_428._M_allocated_capacity + 1));
      }
      pIVar19 = Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_250,
                           (pVVar23->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_438,&local_2b8,pIVar19);
      pMVar9 = local_280.out0.
               super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = local_4f0._40_8_;
      local_1a8._16_8_ = local_428._M_allocated_capacity;
      local_1a8._0_8_ = local_438._0_8_;
      local_1a8._8_8_ = local_438._8_8_;
      local_168 = local_3f8;
      dStack_170 = (double)CONCAT44(uStack_3fc,uStack_400);
      local_178 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
                   *)DStack_410._8_8_;
      dStack_180 = (double)CONCAT44(DStack_410.basic.precision,DStack_410.basic.type);
      local_1a8._24_8_ = local_428._8_8_;
      p_Stack_188 = local_418;
      local_160.m_hi = local_3f0.m_hi;
      local_160.m_hasNaN = local_3f0.m_hasNaN;
      local_160._1_7_ = local_3f0._1_7_;
      local_160.m_lo = local_3f0.m_lo;
      bVar24 = 1;
      lVar20 = 0;
      pIVar18 = (IVal *)local_1a8;
      do {
        bVar11 = contains<tcu::Vector<float,2>>(pIVar18,pMVar9[uVar8].m_data.m_data + lVar20);
        lVar20 = 1;
        bVar7 = bVar24 & bVar11;
        bVar24 = 0;
        pIVar18 = (IVal *)&local_178;
      } while (bVar7 != 0);
      local_438._0_8_ = &local_428;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 0 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(local_440,bVar11,(string *)local_438);
      poVar1 = (ostringstream *)(local_438 + 8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ != &local_428) {
        operator_delete((void *)local_438._0_8_,(ulong)(local_428._M_allocated_capacity + 1));
      }
      pVVar23 = (Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
                 *)local_4f0._32_8_;
      pPVar22 = local_528;
      if ((!bVar10 || !bVar11) &&
         (uVar13 = (int)local_490 + 1, local_490 = (ulong)uVar13, (int)uVar13 < 0x65)) {
        local_438._0_8_ = ((local_528->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar4 = (pVVar23->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        val = (Vector<float,_2> *)local_4f0;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        local_500._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_500,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_500._0_8_,local_500._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_520,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((long)((local_488->in0).
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_448),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)CONCAT44(local_520._4_4_,local_520._0_4_),local_518);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_520._4_4_,local_520._0_4_) != &local_510) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_520._4_4_,local_520._0_4_),
                          local_510._M_allocated_capacity + 1);
        }
        if ((Vector<float,_2> *)local_500._0_8_ != (Vector<float,_2> *)local_4f0) {
          operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar6 = (((VariableP<tcu::Matrix<float,_2,_2>_> *)((long)pVVar23 + 0x40))->
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                 ).m_ptr;
        pIVar19 = (IVal *)local_4f0;
        pcVar5 = (pVVar6->m_name)._M_dataplus._M_p;
        local_500._0_8_ = pIVar19;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_500,pcVar5,pcVar5 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_500._0_8_,local_500._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        valueToString<tcu::Matrix<float,2,2>>
                  ((string *)local_520,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   (local_280.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar8),
                   (Matrix<float,_2,_2> *)pIVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)CONCAT44(local_520._4_4_,local_520._0_4_),local_518);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,2>>
                  ((string *)(local_4f0 + 0x40),(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)local_1a8,pIVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_520._4_4_,local_520._0_4_) != &local_510) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_520._4_4_,local_520._0_4_),
                          local_510._M_allocated_capacity + 1);
        }
        if ((IVal *)local_500._0_8_ != (IVal *)local_4f0) {
          operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar4 = (((VariableP<tcu::Vector<float,_2>_> *)((long)pVVar23 + 0x50))->
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 ).m_ptr;
        pIVar18 = (IVal *)local_4f0;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        local_500._0_8_ = pIVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_500,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_500._0_8_,local_500._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_520,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((long)(local_280.out1.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_448),
                   (Vector<float,_2> *)pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)CONCAT44(local_520._4_4_,local_520._0_4_),local_518);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,2>>
                  ((string *)(local_4f0 + 0x40),(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)local_478,pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_520._4_4_,local_520._0_4_) != &local_510) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_520._4_4_,local_520._0_4_),
                          local_510._M_allocated_capacity + 1);
        }
        if ((IVal *)local_500._0_8_ != (IVal *)local_4f0) {
          operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_3c0);
      }
      local_4f0._40_8_ = local_4f0._40_8_ + 1;
    } while ((double)local_4f0._40_8_ != local_288);
    iVar12 = (int)local_490;
    if (iVar12 < 0x65) {
      if (iVar12 == 0) goto LAB_0086538e;
    }
    else {
      local_438._0_8_ = ((pPVar22->super_TestCase).super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_438 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(Skipped ",9);
      std::ostream::operator<<(poVar1,iVar12 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_3c0);
    }
    local_438._0_8_ = ((pPVar22->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_438 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::ostream::operator<<(poVar1,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_438 + 8));
  std::ios_base::~ios_base(local_3c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_280.out1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.out1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_280.out0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}